

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_setopt.c
# Opt level: O1

CURLcode tool_setopt(CURL *curl,_Bool str,GlobalConfig *global,OperationConfig *config,char *name,
                    CURLoption tag,...)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  CURLcode CVar4;
  char *pcVar5;
  size_t len;
  NameValue *pNVar6;
  char *pcVar7;
  bool bVar8;
  char *in_stack_00000008;
  va_list arg;
  char buf [256];
  char local_138 [264];
  
  if (tag < 10000) {
    pcVar5 = "CURLOPT_SSL_VERIFYPEER";
    pNVar6 = setopt_nv_CURLNONZERODEFAULTS;
    pcVar7 = (char *)0x0;
    do {
      pNVar6 = pNVar6 + 1;
      iVar3 = strcmp(name,pcVar5);
      if (iVar3 == 0) {
        pcVar7 = (char *)pNVar6[-1].value;
        break;
      }
      pcVar5 = pNVar6->name;
    } while (pcVar5 != (char *)0x0);
    curl_msnprintf(local_138,0x100,"%ldL",in_stack_00000008);
    CVar4 = curl_easy_setopt(curl,tag,in_stack_00000008);
    bVar8 = in_stack_00000008 == pcVar7;
LAB_0011c5d6:
    bVar2 = false;
    in_stack_00000008 = local_138;
    bVar1 = false;
  }
  else {
    if (29999 < tag) {
      if (39999 < tag) {
        pcVar5 = "blob pointer";
        goto LAB_0011c6ed;
      }
      curl_msnprintf(local_138,0x100,"(curl_off_t)%ld",in_stack_00000008);
      CVar4 = curl_easy_setopt(curl,tag,in_stack_00000008);
      bVar8 = in_stack_00000008 == (char *)0x0;
      goto LAB_0011c5d6;
    }
    if (tag < 20000) {
      if (in_stack_00000008 == (char *)0x0 || !str) {
        pcVar5 = "object pointer";
        goto LAB_0011c6ed;
      }
      bVar2 = true;
      bVar8 = false;
      bVar1 = false;
    }
    else {
      pcVar5 = "function pointer";
LAB_0011c6ed:
      bVar1 = in_stack_00000008 != (char *)0x0;
      bVar8 = in_stack_00000008 == (char *)0x0;
      if (bVar8) {
        pcVar5 = in_stack_00000008;
      }
      in_stack_00000008 = pcVar5;
      bVar2 = false;
    }
    CVar4 = curl_easy_setopt(curl,tag);
  }
  pcVar5 = (char *)0x0;
  if (((global->libcurl != (char *)0x0) && (!bVar8)) && (CVar4 == CURLE_OK)) {
    if (bVar1) {
      pcVar5 = "";
      if (*in_stack_00000008 == 'o') {
        pcVar5 = "n";
      }
      CVar4 = easysrc_addf(&easysrc_toohard,"%s was set to a%s %s",name,pcVar5,in_stack_00000008);
    }
    else {
      if (bVar2) {
        len = 0xffffffffffffffff;
        if (tag == CURLOPT_POSTFIELDS) {
          len = curlx_dyn_len(&config->postdata);
        }
        pcVar5 = c_escape(in_stack_00000008,len);
        if (pcVar5 == (char *)0x0) {
          iVar3 = 7;
          CVar4 = CURLE_OUT_OF_MEMORY;
        }
        else {
          CVar4 = easysrc_addf(&easysrc_code,"curl_easy_setopt(hnd, %s, \"%s\");",name,pcVar5);
          iVar3 = 7;
          if (CVar4 == CURLE_OK) {
            iVar3 = 0;
          }
        }
        if ((iVar3 != 0) && (iVar3 != 7)) {
          return CVar4;
        }
        goto LAB_0011c7f6;
      }
      CVar4 = easysrc_addf(&easysrc_code,"curl_easy_setopt(hnd, %s, %s);",name,in_stack_00000008);
    }
    pcVar5 = (char *)0x0;
  }
LAB_0011c7f6:
  free(pcVar5);
  return CVar4;
}

Assistant:

CURLcode tool_setopt(CURL *curl, bool str, struct GlobalConfig *global,
                     struct OperationConfig *config,
                     const char *name, CURLoption tag, ...)
{
  va_list arg;
  char buf[256];
  const char *value = NULL;
  bool remark = FALSE;
  bool skip = FALSE;
  bool escape = FALSE;
  char *escaped = NULL;
  CURLcode ret = CURLE_OK;

  va_start(arg, tag);

  if(tag < CURLOPTTYPE_OBJECTPOINT) {
    /* Value is expected to be a long */
    long lval = va_arg(arg, long);
    long defval = 0L;
    const struct NameValue *nv = NULL;
    for(nv = setopt_nv_CURLNONZERODEFAULTS; nv->name; nv++) {
      if(!strcmp(name, nv->name)) {
        defval = nv->value;
        break; /* found it */
      }
    }

    msnprintf(buf, sizeof(buf), "%ldL", lval);
    value = buf;
    ret = curl_easy_setopt(curl, tag, lval);
    if(lval == defval)
      skip = TRUE;
  }
  else if(tag < CURLOPTTYPE_OFF_T) {
    /* Value is some sort of object pointer */
    void *pval = va_arg(arg, void *);

    /* function pointers are never printable */
    if(tag >= CURLOPTTYPE_FUNCTIONPOINT) {
      if(pval) {
        value = "function pointer";
        remark = TRUE;
      }
      else
        skip = TRUE;
    }

    else if(pval && str) {
      value = (char *)pval;
      escape = TRUE;
    }
    else if(pval) {
      value = "object pointer";
      remark = TRUE;
    }
    else
      skip = TRUE;

    ret = curl_easy_setopt(curl, tag, pval);

  }
  else if(tag < CURLOPTTYPE_BLOB) {
    /* Value is expected to be curl_off_t */
    curl_off_t oval = va_arg(arg, curl_off_t);
    msnprintf(buf, sizeof(buf),
              "(curl_off_t)%" CURL_FORMAT_CURL_OFF_T, oval);
    value = buf;
    ret = curl_easy_setopt(curl, tag, oval);

    if(!oval)
      skip = TRUE;
  }
  else {
    /* Value is a blob */
    void *pblob = va_arg(arg, void *);

    /* blobs are never printable */
    if(pblob) {
      value = "blob pointer";
      remark = TRUE;
    }
    else
      skip = TRUE;

    ret = curl_easy_setopt(curl, tag, pblob);
  }

  va_end(arg);

  if(global->libcurl && !skip && !ret) {
    /* we only use this for real if --libcurl was used */

    if(remark)
      REM3("%s was set to a%s %s", name, (*value == 'o' ? "n" : ""), value);
    else {
      if(escape) {
        curl_off_t len = ZERO_TERMINATED;
        if(tag == CURLOPT_POSTFIELDS)
          len = curlx_dyn_len(&config->postdata);
        escaped = c_escape(value, len);
        NULL_CHECK(escaped);
        CODE2("curl_easy_setopt(hnd, %s, \"%s\");", name, escaped);
      }
      else
        CODE2("curl_easy_setopt(hnd, %s, %s);", name, value);
    }
  }

nomem:
  Curl_safefree(escaped);
  return ret;
}